

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

Token * make_token(Token *__return_storage_ptr__,Scanner *scanner,TokenType type)

{
  TokenType type_local;
  Scanner *scanner_local;
  
  __return_storage_ptr__->type = type;
  __return_storage_ptr__->start = scanner->start;
  __return_storage_ptr__->length = (ulong)(uint)((int)scanner->current - (int)scanner->start);
  __return_storage_ptr__->line = scanner->line;
  return __return_storage_ptr__;
}

Assistant:

static Token make_token(Scanner *scanner, TokenType type) {
    Token token;
    token.type = type;
    token.start = scanner->start;
    token.length = (unsigned int) (scanner->current - scanner->start);
    token.line = scanner->line;

    return token;
}